

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
          (arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *this,handle handle)

{
  size_t *psVar1;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *pbVar2;
  char *pcVar3;
  long lVar4;
  
  if (this->ptr_ != (char *)0x0) {
    pbVar2 = this->parse_ctx_;
    pcVar3 = (pbVar2->format_str_).data_;
    lVar4 = (long)this->ptr_ - (long)pcVar3;
    if (lVar4 < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                  ,0x13c,"negative value");
    }
    (pbVar2->format_str_).data_ = pcVar3 + lVar4;
    psVar1 = &(pbVar2->format_str_).size_;
    *psVar1 = *psVar1 - lVar4;
  }
  (*handle.custom_.format)(handle.custom_.value,this->parse_ctx_,this->ctx_);
  return (iterator)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (this->ctx_->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

iterator operator()(typename basic_format_arg<context_type>::handle handle) {
    if (ptr_) advance_to(*parse_ctx_, ptr_);
    handle.format(*parse_ctx_, ctx_);
    return ctx_.out();
  }